

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O0

Matrix<Rational> __thiscall Matrix<Rational>::operator/(Matrix<Rational> *this,Rational *a)

{
  Rational *in_RDX;
  Rational *extraout_RDX;
  Rational *in_RDI;
  Matrix<Rational> MVar1;
  Rational *in_stack_00000018;
  Matrix<Rational> *in_stack_00000020;
  Matrix<Rational> temp;
  Rational *pRVar2;
  Matrix<Rational> *in_stack_ffffffffffffff88;
  Matrix<Rational> *in_stack_ffffffffffffff90;
  
  pRVar2 = in_RDI;
  Matrix(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  Rational::Rational(in_RDX,pRVar2);
  operator/=(in_stack_00000020,in_stack_00000018);
  Matrix(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  Rational::~Rational(in_RDI);
  ~Matrix((Matrix<Rational> *)in_RDX);
  MVar1.arr = extraout_RDX;
  MVar1._0_8_ = pRVar2;
  return MVar1;
}

Assistant:

inline const Matrix operator/(Field a) const
    {
        Matrix temp(*this);
        return temp /= a;
    }